

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O2

bool __thiscall
handlegraph::PathMetadata::for_each_step_of_sense_impl
          (PathMetadata *this,handle_t *visited,PathSense *sense,
          function<bool_(const_handlegraph::step_handle_t_&)> *iteratee)

{
  int iVar1;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(PathMetadata **)local_48._M_unused._0_8_ = this;
  *(PathSense **)((long)local_48._M_unused._0_8_ + 8) = sense;
  *(function<bool_(const_handlegraph::step_handle_t_&)> **)((long)local_48._M_unused._0_8_ + 0x10) =
       iteratee;
  pcStack_30 = std::
               _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/path_metadata.cpp:362:50)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/path_metadata.cpp:362:50)>
             ::_M_manager;
  iVar1 = (*this->_vptr_PathMetadata[0xd])(this,visited);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return SUB41(iVar1,0);
}

Assistant:

bool PathMetadata::for_each_step_of_sense_impl(const handle_t& visited, const PathSense& sense, const std::function<bool(const step_handle_t&)>& iteratee) const {
    return for_each_step_on_handle_impl(visited, [&](const step_handle_t& handle) {
        if (get_sense(get_path_handle_of_step(handle)) != sense) {
            // Skip this non-matching path's step
            return true;
        }
        // And emit any steps on matching paths
        return iteratee(handle);
    });
}